

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.hpp
# Opt level: O0

int qpixl::writePGMA<std::vector<double,std::allocator<double>>>
              (string *fileName,vector<double,_std::allocator<double>_> *data,size_t nrows,
              size_t ncols,size_t maxval,int zeroPad)

{
  byte bVar1;
  ostream *poVar2;
  void *pvVar3;
  size_t sVar4;
  reference pvVar5;
  int *piVar6;
  double dVar7;
  int local_26c [3];
  int local_260;
  int local_25c;
  int col;
  int row;
  size_t ldm;
  ostream local_240 [8];
  ofstream ostrm;
  int iStack_38;
  int zeroPad_local;
  size_t maxval_local;
  size_t ncols_local;
  size_t nrows_local;
  vector<double,_std::allocator<double>_> *data_local;
  string *fileName_local;
  
  std::ofstream::ofstream(local_240,(string *)fileName,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR -- failed to open ");
    poVar2 = std::operator<<(poVar2,(string *)fileName);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    fileName_local._4_4_ = -1;
  }
  else {
    poVar2 = std::operator<<(local_240,"P2");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(local_240,"# Generated by QPIXL++");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = (ostream *)std::ostream::operator<<(local_240,ncols);
    poVar2 = std::operator<<(poVar2," ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,nrows);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    pvVar3 = (void *)std::ostream::operator<<(local_240,maxval);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    _col = 0;
    sVar4 = nrows;
    if ((zeroPad != 0) && (sVar4 = nrows, zeroPad != 2)) {
      if (zeroPad != 1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR -- zeroPad : ");
        pvVar3 = (void *)std::ostream::operator<<(poVar2,zeroPad);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        fileName_local._4_4_ = -3;
        goto LAB_0010c0b3;
      }
      sVar4 = nextpow2(nrows);
    }
    _col = sVar4;
    for (local_25c = 0; (ulong)(long)local_25c < nrows; local_25c = local_25c + 1) {
      for (local_260 = 0; (ulong)(long)local_260 < ncols; local_260 = local_260 + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (data,(long)local_25c + (long)local_260 * _col);
        dVar7 = ceil(*pvVar5);
        local_26c[2] = (int)dVar7;
        local_26c[1] = 0;
        piVar6 = std::max<int>(local_26c + 2,local_26c + 1);
        iStack_38 = (int)maxval;
        local_26c[0] = iStack_38;
        piVar6 = std::min<int>(piVar6,local_26c);
        poVar2 = (ostream *)std::ostream::operator<<(local_240,*piVar6);
        std::operator<<(poVar2," ");
      }
      std::ostream::operator<<(local_240,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    fileName_local._4_4_ = 0;
  }
LAB_0010c0b3:
  ldm._0_4_ = 1;
  std::ofstream::~ofstream(local_240);
  return fileName_local._4_4_;
}

Assistant:

int writePGMA( const std::string fileName, V& data , const size_t nrows , 
                 const size_t ncols , const size_t maxval , 
                 const int zeroPad = 0 ) {
    using T = typename V::value_type ; 
    std::ofstream ostrm( fileName , std::ios::out ) ;

    if ( !ostrm.is_open( ) ) {
      std::cerr << "ERROR -- failed to open " << fileName << std::endl ;
      return -1 ;
    } else {

      // Write header
      ostrm << "P2" << std::endl ;
      ostrm << "# Generated by QPIXL++" << std::endl ;
      ostrm << ncols << " " << nrows << std::endl ;
      ostrm << maxval << std::endl ;

      // Write data
      size_t ldm = 0 ;
      if ( zeroPad == 0 || zeroPad == 2 ) {
        ldm = nrows ;
      } else if ( zeroPad == 1 ) ldm = qpixl::nextpow2( nrows ) ;
      else {
        std::cerr << "ERROR -- zeroPad : " << zeroPad << std::endl ;
          return -3 ;
      }

      for ( int row = 0; row < nrows; ++row ) {
          for ( int col = 0; col < ncols; ++col ) {
            ostrm << std::min( std::max( 
                     int( ceil( data[row + col * ldm] ) ), 0 ), int(maxval) ) 
                  << " " ;    
          }
          ostrm << std::endl ;
      }
    }

    // Close file
    ostrm.close() ;

    return 0 ;
  }